

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rips_persistence.cpp
# Opt level: O1

void program_options(int argc,char **argv,string *off_file_points,string *filediag,
                    Filtration_value *threshold,int *dim_max,int *p,
                    Filtration_value *min_persistence)

{
  uint uVar1;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar2;
  char *pcVar3;
  typed_value<float,_char> *ptVar4;
  typed_value<int,_char> *ptVar5;
  options_description *poVar6;
  const_iterator cVar7;
  ostream *poVar8;
  uint uVar9;
  bool bVar10;
  variables_map vm;
  positional_options_description pos;
  options_description all;
  options_description visible;
  options_description hidden;
  undefined1 local_330 [16];
  undefined1 local_320 [32];
  undefined1 local_300 [16];
  undefined1 local_2f0 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c0 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_290;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_260;
  long *local_248;
  long local_238 [2];
  undefined1 local_228 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1f8 [32];
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_1d8 [32];
  options_description *local_1b8;
  long *local_1b0 [2];
  long local_1a0 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_188 [24];
  void *local_170;
  undefined4 local_168;
  undefined8 local_160;
  undefined4 local_158;
  long local_150;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_148 [24];
  long *local_130 [2];
  long local_120 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_108 [24];
  void *local_f0;
  undefined4 local_e8;
  undefined8 local_e0;
  undefined4 local_d8;
  long local_d0;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_c8 [24];
  long *local_b0 [2];
  long local_a0 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_88 [24];
  void *local_70;
  undefined4 local_68;
  undefined8 local_60;
  undefined4 local_58;
  long local_50;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_48 [24];
  
  local_320._24_8_ = dim_max;
  local_300._0_8_ = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"Hidden options","");
  uVar1 = (uint)boost::program_options::options_description::m_default_line_length;
  uVar9 = (uint)boost::program_options::options_description::m_default_line_length >> 1;
  boost::program_options::options_description::options_description
            ((options_description *)local_b0,(string *)local_300,
             (uint)boost::program_options::options_description::m_default_line_length,uVar9);
  if ((undefined1 *)local_300._0_8_ != local_2f0) {
    operator_delete((void *)local_300._0_8_,CONCAT71(local_2f0._1_7_,local_2f0[0]) + 1);
  }
  local_300._0_8_ = boost::program_options::options_description::add_options();
  ptVar2 = boost::program_options::value<std::__cxx11::string>(off_file_points);
  boost::program_options::options_description_easy_init::operator()
            (local_300,(value_semantic *)0x123461,(char *)ptVar2);
  local_300._0_8_ = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"Allowed options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_130,(string *)local_300,100,uVar9);
  if ((undefined1 *)local_300._0_8_ != local_2f0) {
    operator_delete((void *)local_300._0_8_,CONCAT71(local_2f0._1_7_,local_2f0[0]) + 1);
  }
  local_1b0[0] = (long *)boost::program_options::options_description::add_options();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_1b0,"help,h");
  ptVar2 = boost::program_options::value<std::__cxx11::string>(filediag);
  local_300._8_8_ = (pointer)0x0;
  local_2f0[0] = '\0';
  local_300._0_8_ = local_2f0;
  ptVar2 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_300);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"output-file,o",(char *)ptVar2);
  ptVar4 = boost::program_options::value<float>(threshold);
  local_228._0_4_ = 0x7f800000;
  ptVar4 = boost::program_options::typed_value<float,_char>::default_value
                     (ptVar4,(float *)local_228);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"max-edge-length,r",(char *)ptVar4);
  ptVar5 = boost::program_options::value<int>((int *)local_320._24_8_);
  local_260.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 1;
  ptVar5 = boost::program_options::typed_value<int,_char>::default_value(ptVar5,(int *)&local_260);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"cpx-dimension,d",(char *)ptVar5);
  ptVar5 = boost::program_options::value<int>(p);
  local_330._0_4_ = 0xb;
  ptVar5 = boost::program_options::typed_value<int,_char>::default_value(ptVar5,(int *)local_330);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"field-charac,p",(char *)ptVar5);
  ptVar4 = boost::program_options::value<float>(min_persistence);
  boost::program_options::options_description_easy_init::operator()
            (pcVar3,(value_semantic *)"min-persistence,m",(char *)ptVar4);
  if ((undefined1 *)local_300._0_8_ != local_2f0) {
    operator_delete((void *)local_300._0_8_,CONCAT71(local_2f0._1_7_,local_2f0[0]) + 1);
  }
  boost::program_options::positional_options_description::positional_options_description
            ((positional_options_description *)&local_260);
  boost::program_options::positional_options_description::add((char *)&local_260,0x123461);
  boost::program_options::options_description::options_description
            ((options_description *)local_1b0,uVar1,uVar9);
  poVar6 = (options_description *)
           boost::program_options::options_description::add((options_description *)local_1b0);
  boost::program_options::options_description::add(poVar6);
  boost::program_options::variables_map::variables_map((variables_map *)local_300);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)local_228,argc,argv);
  boost::program_options::detail::cmdline::set_options_description((options_description *)local_228)
  ;
  local_1b8 = (options_description *)local_1b0;
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)local_228);
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)local_330,(basic_command_line_parser<char> *)local_228);
  boost::program_options::store((basic_parsed_options *)local_330,(variables_map *)local_300,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_330);
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1(local_1d8);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(local_1f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_228);
  boost::program_options::notify((variables_map *)local_300);
  local_228._0_8_ = &local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"help","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  *)local_2f0,(key_type *)local_228);
  bVar10 = true;
  if (cVar7._M_node == (_Base_ptr)(local_2f0 + 8)) {
    local_330._0_8_ = local_320;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"input-file","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                    *)local_2f0,(key_type *)local_330);
    bVar10 = cVar7._M_node == (_Base_ptr)(local_2f0 + 8);
    if ((pointer)local_330._0_8_ != (pointer)local_320) {
      operator_delete((void *)local_330._0_8_,(ulong)(local_320._0_8_ + 1));
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228._0_8_ !=
      &local_218) {
    operator_delete((void *)local_228._0_8_,(ulong)(local_218._M_dataplus._M_p + 1));
  }
  if (bVar10) {
    std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,
               "Compute the persistent homology with coefficient field Z/pZ \n",0x3d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"of a Rips complex defined on a set of input points.\n \n",0x36
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,
               "The output diagram contains one bar per line, written with the convention: \n",0x4c)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"   p   dim b d \n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"where dim is the dimension of the homological feature,\n",0x37
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,
               "b and d are respectively the birth and death of the feature and \n",0x41);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,
               "p is the characteristic of the field Z/pZ used for homology coefficients.",0x49);
    poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"Usage: ",7);
    poVar8 = std::operator<<((ostream *)&std::clog,*argv);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," [options] input-file",0x15);
    poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
    std::endl<char,std::char_traits<char>>(poVar8);
    poVar8 = (ostream *)
             boost::program_options::operator<<
                       ((ostream *)&std::clog,(options_description *)local_130);
    std::endl<char,std::char_traits<char>>(poVar8);
    exit(-1);
  }
  local_300._0_8_ = std::__cxx11::istringstream::istringstream;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_290);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_2c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               *)local_2f0);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_148);
  if (local_170 != (void *)0x0) {
    operator_delete(local_170,local_150 - (long)local_170);
    local_170 = (void *)0x0;
    local_168 = 0;
    local_160 = 0;
    local_158 = 0;
    local_150 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_188);
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0],local_1a0[0] + 1);
  }
  if (local_248 != local_238) {
    operator_delete(local_248,local_238[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_260);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_c8);
  if (local_f0 != (void *)0x0) {
    operator_delete(local_f0,local_d0 - (long)local_f0);
    local_f0 = (void *)0x0;
    local_e8 = 0;
    local_e0 = 0;
    local_d8 = 0;
    local_d0 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_108);
  if (local_130[0] != local_120) {
    operator_delete(local_130[0],local_120[0] + 1);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_48);
  if (local_70 != (void *)0x0) {
    operator_delete(local_70,local_50 - (long)local_70);
    local_70 = (void *)0x0;
    local_68 = 0;
    local_60 = 0;
    local_58 = 0;
    local_50 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_88);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  return;
}

Assistant:

void program_options(int argc, char* argv[], std::string& off_file_points, std::string& filediag,
                     Filtration_value& threshold, int& dim_max, int& p, Filtration_value& min_persistence) {
  namespace po = boost::program_options;
  po::options_description hidden("Hidden options");
  hidden.add_options()("input-file", po::value<std::string>(&off_file_points),
                       "Name of an OFF file containing a point set.\n");

  po::options_description visible("Allowed options", 100);
  visible.add_options()("help,h", "produce help message")(
      "output-file,o", po::value<std::string>(&filediag)->default_value(std::string()),
      "Name of file in which the persistence diagram is written. Default print in standard output")(
      "max-edge-length,r",
      po::value<Filtration_value>(&threshold)->default_value(std::numeric_limits<Filtration_value>::infinity()),
      "Maximal length of an edge for the Rips complex construction.")(
      "cpx-dimension,d", po::value<int>(&dim_max)->default_value(1),
      "Maximal dimension of the Rips complex we want to compute.")(
      "field-charac,p", po::value<int>(&p)->default_value(11),
      "Characteristic p of the coefficient field Z/pZ for computing homology.")(
      "min-persistence,m", po::value<Filtration_value>(&min_persistence),
      "Minimal lifetime of homology feature to be recorded. Default is 0. Enter a negative value to see zero length "
      "intervals");

  po::positional_options_description pos;
  pos.add("input-file", 1);

  po::options_description all;
  all.add(visible).add(hidden);

  po::variables_map vm;
  po::store(po::command_line_parser(argc, argv).options(all).positional(pos).run(), vm);
  po::notify(vm);

  if (vm.count("help") || !vm.count("input-file")) {
    std::clog << std::endl;
    std::clog << "Compute the persistent homology with coefficient field Z/pZ \n";
    std::clog << "of a Rips complex defined on a set of input points.\n \n";
    std::clog << "The output diagram contains one bar per line, written with the convention: \n";
    std::clog << "   p   dim b d \n";
    std::clog << "where dim is the dimension of the homological feature,\n";
    std::clog << "b and d are respectively the birth and death of the feature and \n";
    std::clog << "p is the characteristic of the field Z/pZ used for homology coefficients." << std::endl << std::endl;

    std::clog << "Usage: " << argv[0] << " [options] input-file" << std::endl << std::endl;
    std::clog << visible << std::endl;
    exit(-1);
  }
}